

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Boolean MA_chop_stack(Integer memhandle)

{
  int iVar1;
  Boolean BVar2;
  AD *ad;
  
  ma_stats.calls[2] = ma_stats.calls[2] + 1;
  BVar2 = mh2ad(memhandle,&ad,BL_Stack,"MA_chop_stack");
  if (BVar2 != 0) {
    iVar1 = list_delete_many(&ma_sused,ad_le,(Pointer)ad,mh_free);
    ma_stats.sblocks = ma_stats.sblocks - (long)iVar1;
    ma_stats.sbytes = (long)ma_sp + (ma_stats.sbytes - (long)(ad->name + (ad->nbytes - 0x10)));
    ma_sp = ad->name + (ad->nbytes - 0x10);
  }
  return (ulong)(BVar2 != 0);
}

Assistant:

public Boolean MA_chop_stack(Integer memhandle)/*the block to deallocate up to*/
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_chop_stack]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_Stack, "MA_chop_stack"))
        return MA_FALSE;

    /* delete block and all blocks above it from used list */
#ifdef STATS
    ma_stats.sblocks -=
        list_delete_many(&ma_sused, ad_le, (Pointer)ad, mh_free);
#else
    (void)list_delete_many(&ma_sused, ad_le, (Pointer)ad, mh_free);
#endif /* STATS */

    /* pop block and all blocks above it from stack */
#ifdef STATS
    ma_stats.sbytes -= (((Pointer)ad + ad->nbytes) - ma_sp);
#endif /* STATS */
    ma_sp = (Pointer)ad + ad->nbytes;

    /* success */
    return MA_TRUE;
}